

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.hpp
# Opt level: O2

int __thiscall
zmq::decoder_base_t<zmq::v2_decoder_t,_zmq::shared_message_memory_allocator>::decode
          (decoder_base_t<zmq::v2_decoder_t,_zmq::shared_message_memory_allocator> *this,
          uchar *data_,size_t size_,size_t *bytes_used_)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  code *pcVar4;
  uchar *puVar5;
  ulong uVar6;
  size_t sVar7;
  long *plVar8;
  
  *bytes_used_ = 0;
  puVar5 = this->_read_pos;
  if (puVar5 == data_) {
    uVar6 = this->_to_read;
    if (uVar6 < size_) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","size_ <= _to_read",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/decoder.hpp"
              ,0x6e);
      fflush(_stderr);
      zmq_abort("size_ <= _to_read");
      puVar5 = this->_read_pos;
      uVar6 = this->_to_read;
    }
    this->_read_pos = puVar5 + size_;
    this->_to_read = uVar6 - size_;
    *bytes_used_ = size_;
    do {
      if (this->_to_read != 0) {
        return 0;
      }
      pcVar4 = (code *)this->_next;
      plVar8 = (long *)((long)&(this->super_i_decoder)._vptr_i_decoder + *(long *)&this->field_0x10)
      ;
      if (((ulong)pcVar4 & 1) != 0) {
        pcVar4 = *(code **)(pcVar4 + *plVar8 + -1);
      }
      iVar2 = (*pcVar4)(plVar8,data_ + *bytes_used_);
    } while (iVar2 == 0);
  }
  else {
    iVar2 = 0;
    sVar7 = 0;
    while (uVar6 = size_ - sVar7, sVar7 <= size_ && uVar6 != 0) {
      puVar5 = this->_read_pos;
      uVar3 = this->_to_read;
      if (uVar3 <= uVar6) {
        uVar6 = uVar3;
      }
      if (puVar5 != data_ + sVar7) {
        memcpy(puVar5,data_ + sVar7,uVar6);
        puVar5 = this->_read_pos;
        uVar3 = this->_to_read;
      }
      this->_read_pos = puVar5 + uVar6;
      this->_to_read = uVar3 - uVar6;
      *bytes_used_ = *bytes_used_ + uVar6;
      while (this->_to_read == 0) {
        pcVar4 = (code *)this->_next;
        plVar8 = (long *)((long)&(this->super_i_decoder)._vptr_i_decoder +
                         *(long *)&this->field_0x10);
        if (((ulong)pcVar4 & 1) != 0) {
          pcVar4 = *(code **)(pcVar4 + *plVar8 + -1);
        }
        iVar1 = (*pcVar4)(plVar8,data_ + *bytes_used_);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      sVar7 = *bytes_used_;
    }
  }
  return iVar2;
}

Assistant:

int decode (const unsigned char *data_,
                std::size_t size_,
                std::size_t &bytes_used_) ZMQ_FINAL
    {
        bytes_used_ = 0;

        //  In case of zero-copy simply adjust the pointers, no copying
        //  is required. Also, run the state machine in case all the data
        //  were processed.
        if (data_ == _read_pos) {
            zmq_assert (size_ <= _to_read);
            _read_pos += size_;
            _to_read -= size_;
            bytes_used_ = size_;

            while (!_to_read) {
                const int rc =
                  (static_cast<T *> (this)->*_next) (data_ + bytes_used_);
                if (rc != 0)
                    return rc;
            }
            return 0;
        }

        while (bytes_used_ < size_) {
            //  Copy the data from buffer to the message.
            const size_t to_copy = std::min (_to_read, size_ - bytes_used_);
            // Only copy when destination address is different from the
            // current address in the buffer.
            if (_read_pos != data_ + bytes_used_) {
                memcpy (_read_pos, data_ + bytes_used_, to_copy);
            }

            _read_pos += to_copy;
            _to_read -= to_copy;
            bytes_used_ += to_copy;
            //  Try to get more space in the message to fill in.
            //  If none is available, return.
            while (_to_read == 0) {
                // pass current address in the buffer
                const int rc =
                  (static_cast<T *> (this)->*_next) (data_ + bytes_used_);
                if (rc != 0)
                    return rc;
            }
        }

        return 0;
    }